

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-world.c
# Opt level: O2

char * level_name(level_conflict *lev)

{
  char *pcVar1;
  
  if (lev->depth != 0) {
    pcVar1 = format("%s %d",locality_names[lev->locality].name);
    return pcVar1;
  }
  pcVar1 = format("%s Town",locality_names[lev->locality].name);
  return pcVar1;
}

Assistant:

char *level_name(struct level *lev)
{
	char *name;

	if (lev->depth) {
		name = format("%s %d", locality_name(lev->locality), lev->depth);
	} else {
		name = format("%s Town", locality_name(lev->locality));
	}
	return name;
}